

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O1

void telnet_send_zmp(telnet_t *telnet,size_t argc,char **argv)

{
  char *__s;
  size_t sVar1;
  int in_ECX;
  size_t sVar2;
  undefined2 local_2a;
  
  telnet_begin_zmp(telnet,*argv);
  if (argc != 1) {
    sVar2 = 1;
    do {
      __s = argv[sVar2];
      sVar1 = strlen(__s);
      telnet_send(telnet,__s,sVar1 + 1);
      sVar2 = sVar2 + 1;
    } while (argc != sVar2);
  }
  local_2a = 0xf0ff;
  _send((int)telnet,&local_2a,2,in_ECX);
  return;
}

Assistant:

void telnet_send_zmp(telnet_t *telnet, size_t argc, const char **argv) {
	size_t i;

	/* ZMP header */
	telnet_begin_zmp(telnet, argv[0]);

	/* send out each argument, including trailing NUL byte */
	for (i = 1; i != argc; ++i)
		telnet_zmp_arg(telnet, argv[i]);

	/* ZMP footer */
	telnet_finish_zmp(telnet);
}